

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.hpp
# Opt level: O3

QuadTerms * __thiscall
mp::BucketAccum1Type<mp::QuadTerms>::ExtractSum
          (QuadTerms *__return_storage_ptr__,BucketAccum1Type<mp::QuadTerms> *this)

{
  size_ty sVar1;
  size_ty *psVar2;
  ulong i;
  size_t i_00;
  QuadTerms local_2b0;
  QuadTerms local_170;
  
  (__return_storage_ptr__->folded_).
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_capacity =
       8;
  (__return_storage_ptr__->folded_).
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->folded_).
             super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
             m_data.m_storage;
  i = 0;
  (__return_storage_ptr__->folded_).
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size = 0;
  (__return_storage_ptr__->coefs_aux_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->coefs_aux_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->coefs_aux_).
             super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
  (__return_storage_ptr__->coefs_aux_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (__return_storage_ptr__->vars1_aux_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->vars1_aux_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->vars1_aux_).super_small_vector_base<std::allocator<int>,_6U>.
             m_data.m_storage;
  (__return_storage_ptr__->vars1_aux_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  (__return_storage_ptr__->vars2_aux_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->vars2_aux_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->vars2_aux_).super_small_vector_base<std::allocator<int>,_6U>.
             m_data.m_storage;
  (__return_storage_ptr__->vars2_aux_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  psVar2 = &(this->buckets_)._M_elems[1].folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_size;
  while (psVar2[-0x28] == 0) {
    i = i + 1;
    psVar2 = psVar2 + 0x28;
    if (i == 0x40) {
      return __return_storage_ptr__;
    }
  }
  ExtractBucket(&local_2b0,this,i);
  if (&local_2b0 != __return_storage_ptr__) {
    gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
    move_assign_default<8U,_nullptr>
              ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               __return_storage_ptr__,
               (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               &local_2b0);
    gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
              (&(__return_storage_ptr__->coefs_aux_).
                super_small_vector_base<std::allocator<double>,_6U>,
               &local_2b0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>);
    gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
              (&(__return_storage_ptr__->vars1_aux_).
                super_small_vector_base<std::allocator<int>,_6U>,
               &local_2b0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>);
    gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
              (&(__return_storage_ptr__->vars2_aux_).
                super_small_vector_base<std::allocator<int>,_6U>,
               &local_2b0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>);
  }
  if (6 < local_2b0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_2b0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_2b0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_2b0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_2b0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_2b0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_2b0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_2b0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_2b0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < local_2b0.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(local_2b0.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    local_2b0.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (0x3e < i) {
    return __return_storage_ptr__;
  }
  i_00 = i + 1;
  do {
    if (*psVar2 != 0) {
      sVar1 = (__return_storage_ptr__->folded_).
              super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
              m_data.
              super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
              m_size;
      if (sVar1 == 0) {
        ExtractBucket(&local_2b0,this,i_00);
      }
      else {
        ExtractBucket(&local_170,this,i_00);
        MergeSorted<mp::QuadTerms>(&local_2b0,&local_170,__return_storage_ptr__);
      }
      if (&local_2b0 != __return_storage_ptr__) {
        gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
        ::move_assign_default<8U,_nullptr>
                  ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *
                   )__return_storage_ptr__,
                   (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *
                   )&local_2b0);
        gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
                  (&(__return_storage_ptr__->coefs_aux_).
                    super_small_vector_base<std::allocator<double>,_6U>,
                   &local_2b0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>);
        gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                  (&(__return_storage_ptr__->vars1_aux_).
                    super_small_vector_base<std::allocator<int>,_6U>,
                   &local_2b0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>);
        gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                  (&(__return_storage_ptr__->vars2_aux_).
                    super_small_vector_base<std::allocator<int>,_6U>,
                   &local_2b0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>);
      }
      if (6 < local_2b0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_2b0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data
                        .super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_2b0.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data
                        .super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_2b0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_2b0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data
                        .super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_2b0.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data
                        .super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_2b0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_2b0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                        m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_2b0.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                        m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3
                       );
      }
      if (8 < local_2b0.folded_.
              super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
              m_data.
              super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
              m_capacity) {
        operator_delete(local_2b0.folded_.
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_data_ptr,
                        local_2b0.folded_.
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_capacity << 4);
      }
      if (sVar1 != 0) {
        if (6 < local_170.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_170.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.
                          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_170.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.
                          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2)
          ;
        }
        if (6 < local_170.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
          operator_delete(local_170.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.
                          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                          local_170.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.
                          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2)
          ;
        }
        if (6 < local_170.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
          operator_delete(local_170.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                          m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                          local_170.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.
                          m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity <<
                          3);
        }
        if (8 < local_170.folded_.
                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                .m_data.
                super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                .m_capacity) {
          operator_delete(local_170.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_data_ptr,
                          local_170.folded_.
                          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                          .m_data.
                          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                          .m_capacity << 4);
        }
      }
    }
    i_00 = i_00 + 1;
    psVar2 = psVar2 + 0x28;
  } while (i_00 != 0x40);
  return __return_storage_ptr__;
}

Assistant:

Body BucketAccum1Type<Body>::ExtractSum() {
  Body result;

  size_t i_bucket = 0;
  for ( ; i_bucket<buckets_.size(); ++i_bucket)
    if (HasBucket(i_bucket)) {
      result = ExtractBucket(i_bucket);
      break;
    }

  while ( ++i_bucket<buckets_.size())
    if (HasBucket(i_bucket)) {
      result
          = result.size()
          ? MergeSorted(ExtractBucket(i_bucket), result)
          : ExtractBucket(i_bucket);
    }

  return result;
}